

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

uint __thiscall wasm::Type::getByteSize(Type *this)

{
  ulong uVar1;
  uint uVar2;
  Type *pTVar3;
  Type *pTVar4;
  uint uVar5;
  Type *pTVar6;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  uVar1 = this->id;
  if ((uVar1 & 1) == 0 || uVar1 < 7) {
    if (6 < uVar1) {
LAB_00cac75e:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    uVar5 = (int)uVar1 - 2;
    if (4 < uVar5) {
LAB_00cac77d:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x29a);
    }
    uVar5 = *(uint *)(&DAT_00e3763c + (ulong)uVar5 * 4);
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_40 = (undefined1  [8])this;
    pTVar3 = (Type *)size(this);
    if (pTVar3 == (Type *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      pTVar4 = (Type *)0x1;
      do {
        pTVar6 = pTVar4;
        pTVar4 = Iterator::operator*((Iterator *)local_40);
        if (6 < pTVar4->id) goto LAB_00cac75e;
        uVar2 = (int)pTVar4->id - 2;
        if (4 < uVar2) goto LAB_00cac77d;
        uVar5 = uVar5 + *(int *)(&DAT_00e3763c + (ulong)uVar2 * 4);
        pTVar4 = (Type *)((long)&pTVar6->id + 1);
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar6
        ;
      } while (pTVar6 != pTVar3);
    }
  }
  return uVar5;
}

Assistant:

unsigned Type::getByteSize() const {
  // TODO: alignment?
  auto getSingleByteSize = [](Type t) {
    switch (t.getBasic()) {
      case Type::i32:
      case Type::f32:
        return 4;
      case Type::i64:
      case Type::f64:
        return 8;
      case Type::v128:
        return 16;
      case Type::none:
      case Type::unreachable:
        break;
    }
    WASM_UNREACHABLE("invalid type");
  };

  if (isTuple()) {
    unsigned size = 0;
    for (const auto& t : *this) {
      size += getSingleByteSize(t);
    }
    return size;
  }
  return getSingleByteSize(*this);
}